

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O2

void math::internal::matrix_householder_vector<double>
               (double *input,int length,double *vector,double *beta,double *epsilon,
               double *norm_factor)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = 0.0;
  for (lVar2 = 1; lVar2 < length; lVar2 = lVar2 + 1) {
    dVar5 = dVar5 + (input[lVar2] / *norm_factor) * (input[lVar2] / *norm_factor);
  }
  *vector = 1.0;
  for (lVar2 = 1; lVar2 < length; lVar2 = lVar2 + 1) {
    vector[lVar2] = input[lVar2] / *norm_factor;
  }
  if ((*epsilon < dVar5) || (dVar5 < 0.0 - *epsilon)) {
    dVar6 = *input / *norm_factor;
    dVar4 = dVar6 * dVar6 + dVar5;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar6 = (double)(~-(ulong)(dVar6 < *epsilon) & (ulong)(-dVar5 / (dVar6 + dVar4)) |
                    (ulong)(dVar6 - dVar4) & -(ulong)(dVar6 < *epsilon));
    *vector = dVar6;
    dVar4 = dVar6 * dVar6;
    *beta = (dVar4 + dVar4) / (dVar4 + dVar5);
    uVar1 = 0;
    uVar3 = (ulong)(uint)length;
    if (length < 1) {
      uVar3 = uVar1;
    }
    for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      vector[uVar1] = vector[uVar1] / dVar6;
    }
  }
  else {
    *beta = 0.0;
  }
  return;
}

Assistant:

void
matrix_householder_vector (T const* input, int length,
    T* vector, T* beta, T const& epsilon, T const& norm_factor)
{
    T sigma(0);
    for (int i = 1; i < length; ++i)
        sigma += MATH_POW2(input[i] / norm_factor);

    vector[0] = T(1);
    for (int i = 1; i < length; ++i)
        vector[i] = input[i] / norm_factor;

    if (MATH_EPSILON_EQ(sigma, T(0), epsilon))
    {
        *beta = T(0);
        return;
    }

    T first = input[0] / norm_factor;
    T mu = std::sqrt(MATH_POW2(first) + sigma);
    if (first < epsilon)
        vector[0] = first - mu;
    else
        vector[0] = -sigma / (first + mu);

    first = vector[0];
    *beta = T(2) * MATH_POW2(first) / (sigma + MATH_POW2(first));
    for (int i = 0; i < length; ++i)
        vector[i] /= first;
}